

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O0

void __thiscall
tf::
ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
::_resolve_token_dependencies
          (ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
           *this,Pipeflow *pf)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  long in_RDI;
  iterator dpf;
  size_t target;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  iterator it;
  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *in_stack_ffffffffffffff78;
  queue<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  *in_stack_ffffffffffffff80;
  _Node_iterator_base<std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_false>
  in_stack_ffffffffffffff88;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_28;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  local_20;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  local_18 [3];
  
  local_18[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0x164016);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
       ::end(in_stack_ffffffffffffff78);
  bVar1 = std::__detail::operator!=(local_18,&local_20);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
                           *)0x164053);
    local_28 = &ppVar2->second;
    local_30._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_ffffffffffffff78);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff78);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_ffffffffffffff80,
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_ffffffffffffff78), bVar1) {
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(&local_30);
      std::
      unordered_map<unsigned_long,_tf::DeferredPipeflow,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>_>
      ::find((unordered_map<unsigned_long,_tf::DeferredPipeflow,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>_>
              *)in_stack_ffffffffffffff78,(key_type *)0x1640ba);
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_false,_false>::operator->
                ((_Node_iterator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_false,_false>
                  *)0x1640c9);
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::erase((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_false,_false>::operator->
                ((_Node_iterator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_false,_false>
                  *)0x1640ec);
      bVar1 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::empty((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)0x1640fc);
      if (bVar1) {
        in_stack_ffffffffffffff80 =
             (queue<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
              *)(in_RDI + 0x70);
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_false,_false>
                               *)0x16411a);
        in_stack_ffffffffffffff88._M_cur = (__node_type *)&ppVar3->second;
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_false,_false>::
        operator->((_Node_iterator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_false,_false>
                    *)0x16412d);
        std::
        queue<std::pair<unsigned_long,unsigned_long>,std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
        ::emplace<unsigned_long&,unsigned_long&>
                  (in_stack_ffffffffffffff80,(unsigned_long *)in_stack_ffffffffffffff78,
                   (unsigned_long *)0x164147);
        std::
        unordered_map<unsigned_long,_tf::DeferredPipeflow,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>_>
        ::erase((unordered_map<unsigned_long,_tf::DeferredPipeflow,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>_>
                 *)in_stack_ffffffffffffff80,(iterator)in_stack_ffffffffffffff88._M_cur);
      }
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_30);
    }
    std::
    unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::erase((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             *)in_stack_ffffffffffffff80,(iterator)in_stack_ffffffffffffff88._M_cur);
  }
  return;
}

Assistant:

void ScalablePipeline<P>::_resolve_token_dependencies(Pipeflow& pf) {

  if (auto it = _token_dependencies.find(pf._token);
      it != _token_dependencies.end()) {
    
    // iterate tokens that defer to pf._token
    for(size_t target : it->second) {

      auto dpf = _deferred_tokens.find(target);

      assert(dpf != _deferred_tokens.end());

      // erase pf._token from target's _dependents
      dpf->second._dependents.erase(pf._token);
      
      // target has no dependents
      if (dpf->second._dependents.empty()) {
        _ready_tokens.emplace(dpf->second._token, dpf->second._num_deferrals);
        _deferred_tokens.erase(dpf);
      }
    }

    _token_dependencies.erase(it);
  }
}